

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_run.c
# Opt level: O3

pid_t check_fork(void)

{
  __pid_t __pid;
  
  __pid = fork();
  if (-1 < __pid) {
    setpgid(__pid,group_pid);
  }
  return __pid;
}

Assistant:

pid_t check_fork(void)
{
#if defined(HAVE_FORK) && HAVE_FORK==1
    pid_t pid = fork();

    /* Set the process to a process group to be able to kill it easily. */
    if(pid >= 0)
    {
        setpgid(pid, group_pid);
    }
    return pid;
#else /* HAVE_FORK */
    /* Ignoring, as Check is not compiled with fork support. */
    return -1;
#endif /* HAVE_FORK */
}